

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  undefined4 uVar10;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double local_d0;
  double local_b8;
  int local_ac;
  u64 s2;
  double rr [2];
  longdouble r;
  uint local_64;
  int local_60;
  int i;
  int eType;
  int nDigit;
  int eValid;
  int e;
  int esign;
  int d;
  u64 s;
  double *pdStack_38;
  int sign;
  char *zEnd;
  int incr;
  u8 enc_local;
  int length_local;
  double *pResult_local;
  char *z_local;
  
  s._4_4_ = 1;
  _esign = 0;
  e = 0;
  eValid = 1;
  nDigit = 0;
  bVar1 = true;
  i = 0;
  local_60 = 1;
  *pResult = 0.0;
  if (length == 0) {
    return 0;
  }
  if (enc == '\x01') {
    zEnd._4_4_ = 1;
    lVar4 = (long)length;
    pResult_local = (double *)z;
  }
  else {
    zEnd._4_4_ = 2;
    local_64 = 3 - enc;
    while( true ) {
      bVar5 = false;
      if ((int)local_64 < (int)(length & 0xfffffffeU)) {
        bVar5 = z[(int)local_64] == '\0';
      }
      if (!bVar5) break;
      local_64 = local_64 + 2;
    }
    if ((int)local_64 < (int)(length & 0xfffffffeU)) {
      local_60 = -100;
    }
    lVar4 = (long)(int)(local_64 ^ 1);
    pResult_local = (double *)(z + (int)(enc & 1));
  }
  pdStack_38 = (double *)(z + lVar4);
  while( true ) {
    bVar5 = false;
    if (pResult_local < pdStack_38) {
      bVar5 = (""[*(byte *)pResult_local] & 1) != 0;
    }
    if (!bVar5) break;
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
  }
  if (pdStack_38 <= pResult_local) {
    return 0;
  }
  if (*(char *)pResult_local == '-') {
    s._4_4_ = -1;
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
  }
  else if (*(char *)pResult_local == '+') {
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
  }
  while( true ) {
    bVar5 = false;
    if (pResult_local < pdStack_38) {
      bVar5 = (""[*(byte *)pResult_local] & 4) != 0;
    }
    if (!bVar5) break;
    _esign = _esign * 10 + (long)(*(char *)pResult_local + -0x30);
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
    i = i + 1;
    if (0x1999999999999997 < _esign) {
      while( true ) {
        bVar5 = false;
        if (pResult_local < pdStack_38) {
          bVar5 = (""[*(byte *)pResult_local] & 4) != 0;
        }
        if (!bVar5) break;
        pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        e = e + 1;
      }
    }
  }
  if (pResult_local < pdStack_38) {
    if (*(char *)pResult_local == '.') {
      pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
      local_60 = local_60 + 1;
      while( true ) {
        bVar5 = false;
        if (pResult_local < pdStack_38) {
          bVar5 = (""[*(byte *)pResult_local] & 4) != 0;
        }
        if (!bVar5) break;
        if (_esign < 0x1999999999999998) {
          _esign = _esign * 10 + (long)(*(char *)pResult_local + -0x30);
          e = e + -1;
          i = i + 1;
        }
        pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
      }
    }
    if (pResult_local < pdStack_38) {
      if ((*(char *)pResult_local == 'e') || (*(char *)pResult_local == 'E')) {
        pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        bVar1 = false;
        local_60 = local_60 + 1;
        if (pdStack_38 <= pResult_local) goto LAB_00151bba;
        if (*(char *)pResult_local == '-') {
          eValid = -1;
          pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        }
        else if (*(char *)pResult_local == '+') {
          pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        }
        while( true ) {
          bVar5 = false;
          if (pResult_local < pdStack_38) {
            bVar5 = (""[*(byte *)pResult_local] & 4) != 0;
          }
          if (!bVar5) break;
          if (nDigit < 10000) {
            local_ac = nDigit * 10 + *(char *)pResult_local + -0x30;
          }
          else {
            local_ac = 10000;
          }
          nDigit = local_ac;
          pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
          bVar1 = true;
        }
      }
      while( true ) {
        bVar5 = false;
        if (pResult_local < pdStack_38) {
          bVar5 = (""[*(byte *)pResult_local] & 1) != 0;
        }
        if (!bVar5) break;
        pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
      }
    }
  }
LAB_00151bba:
  if (_esign == 0) {
    local_b8 = -0.0;
    if (-1 < s._4_4_) {
      local_b8 = 0.0;
    }
    *pResult = local_b8;
  }
  else {
    for (nDigit = nDigit * eValid + e; 0 < nDigit && _esign < 0x1999999999999999;
        nDigit = nDigit + -1) {
      _esign = _esign * 10;
    }
    for (; nDigit < 0 && _esign % 10 == 0; nDigit = nDigit + 1) {
      _esign = _esign / 10;
    }
    uVar10 = (undefined4)(_esign >> 0x20);
    if (nDigit == 0) {
      auVar6._8_4_ = uVar10;
      auVar6._0_8_ = _esign;
      auVar6._12_4_ = 0x45300000;
      *pResult = (auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)_esign) - 4503599627370496.0);
    }
    else if (sqlite3Config.bUseLongDouble == '\0') {
      auVar7._8_4_ = uVar10;
      auVar7._0_8_ = _esign;
      auVar7._12_4_ = 0x45300000;
      s2 = (u64)((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)_esign) - 4503599627370496.0));
      uVar3 = (long)(double)s2 |
              (long)((double)s2 - 9.223372036854776e+18) & (long)(double)s2 >> 0x3f;
      if (_esign < uVar3) {
        lVar4 = uVar3 - _esign;
        auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
        auVar9._0_8_ = lVar4;
        auVar9._12_4_ = 0x45300000;
        local_d0 = -((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
      }
      else {
        lVar4 = _esign - uVar3;
        auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
        auVar8._0_8_ = lVar4;
        auVar8._12_4_ = 0x45300000;
        local_d0 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
      }
      rr[0] = local_d0;
      if (nDigit < 1) {
        while (nDigit < -99) {
          nDigit = nDigit + 100;
          dekkerMul2((double *)&s2,1e-100,-1.9991899802602883e-117);
        }
        while (nDigit < -9) {
          nDigit = nDigit + 10;
          dekkerMul2((double *)&s2,1e-10,-3.643219731549774e-27);
        }
        while (0x7fffffff < (uint)nDigit) {
          nDigit = nDigit + 1;
          dekkerMul2((double *)&s2,0.1,-5.551115123125783e-18);
        }
      }
      else {
        while (99 < nDigit) {
          nDigit = nDigit + -100;
          dekkerMul2((double *)&s2,1e+100,-1.5902891109759918e+83);
        }
        while (9 < nDigit) {
          nDigit = nDigit + -10;
          dekkerMul2((double *)&s2,10000000000.0,0.0);
        }
        while (0 < nDigit) {
          nDigit = nDigit + -1;
          dekkerMul2((double *)&s2,10.0,0.0);
        }
      }
      *pResult = (double)s2 + rr[0];
      iVar2 = sqlite3IsNaN(*pResult);
      if (iVar2 != 0) {
        *pResult = INFINITY;
      }
    }
    else {
      register0x00001110 =
           (longdouble)*(float *)(&DAT_00203a10 + (ulong)((long)_esign < 0) * 4) +
           (longdouble)(long)_esign;
      if (nDigit < 1) {
        for (; nDigit < -99; nDigit = nDigit + 100) {
          register0x00001110 = _DAT_00203b70 * stack0xffffffffffffff88;
        }
        for (; nDigit < -9; nDigit = nDigit + 10) {
          register0x00001110 = _DAT_00203b60 * stack0xffffffffffffff88;
        }
        for (; 0x7fffffff < (uint)nDigit; nDigit = nDigit + 1) {
          register0x00001110 = _DAT_00203b50 * stack0xffffffffffffff88;
        }
      }
      else {
        for (; 99 < nDigit; nDigit = nDigit + -100) {
          register0x00001110 = _DAT_00203b20 * stack0xffffffffffffff88;
        }
        for (; 9 < nDigit; nDigit = nDigit + -10) {
          register0x00001110 = (longdouble)1e+10 * stack0xffffffffffffff88;
        }
        for (; 0 < nDigit; nDigit = nDigit + -1) {
          register0x00001110 = (longdouble)10.0 * stack0xffffffffffffff88;
        }
      }
      if (stack0xffffffffffffff88 <= (longdouble)1.79769313486232e+308) {
        *pResult = (double)stack0xffffffffffffff88;
      }
      else {
        *pResult = INFINITY;
      }
    }
    if (s._4_4_ < 0) {
      *pResult = -*pResult;
    }
  }
  if ((((pResult_local == pdStack_38) && (0 < i)) && (bVar1)) && (0 < local_60)) {
    z_local._4_4_ = local_60;
  }
  else if (((local_60 < 2) || ((local_60 != 3 && (!bVar1)))) || (i < 1)) {
    z_local._4_4_ = 0;
  }
  else {
    z_local._4_4_ = -1;
  }
  return z_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  u64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  int nDigit = 0;  /* Number of digits processed */
  int eType = 1;   /* 1: pure integer,  2+: fractional  -1 or less: bad UTF16 */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */
  if( length==0 ) return 0;

  if( enc==SQLITE_UTF8 ){
    incr = 1;
    zEnd = z + length;
  }else{
    int i;
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    testcase( enc==SQLITE_UTF16LE );
    testcase( enc==SQLITE_UTF16BE );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    if( i<length ) eType = -100;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigit++;
    if( s>=((LARGEST_UINT64-9)/10) ){
      /* skip non-significant significand digits
      ** (increase exponent by d to shift decimal left) */
      while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; d++; }
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    eType++;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_UINT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
        nDigit++;
      }
      z+=incr;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    eType++;

    /* This branch is needed to avoid a (harmless) buffer overread.  The
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* Zero is a special case */
  if( s==0 ){
    *pResult = sign<0 ? -0.0 : +0.0;
    goto atof_return;
  }

  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;

  /* Try to adjust the exponent to make it smaller */
  while( e>0 && s<(LARGEST_UINT64/10) ){
    s *= 10;
    e--;
  }
  while( e<0 && (s%10)==0 ){
    s /= 10;
    e++;
  }

  if( e==0 ){
    *pResult = s;
  }else if( sqlite3Config.bUseLongDouble ){
    LONGDOUBLE_TYPE r = (LONGDOUBLE_TYPE)s;
    if( e>0 ){
      while( e>=100  ){ e-=100; r *= 1.0e+100L; }
      while( e>=10   ){ e-=10;  r *= 1.0e+10L;  }
      while( e>=1    ){ e-=1;   r *= 1.0e+01L;  }
    }else{
      while( e<=-100 ){ e+=100; r *= 1.0e-100L; }
      while( e<=-10  ){ e+=10;  r *= 1.0e-10L;  }
      while( e<=-1   ){ e+=1;   r *= 1.0e-01L;  }
    }
    assert( r>=0.0 );
    if( r>+1.7976931348623157081452742373e+308L ){
#ifdef INFINITY
      *pResult = +INFINITY;
#else
      *pResult = 1.0e308*10.0;
#endif
    }else{
      *pResult = (double)r;
    }
  }else{
    double rr[2];
    u64 s2;
    rr[0] = (double)s;
    s2 = (u64)rr[0];
#if defined(_MSC_VER) && _MSC_VER<1700
    if( s2==0x8000000000000000LL ){ s2 = 2*(u64)(0.5*rr[0]); }
#endif
    rr[1] = s>=s2 ? (double)(s - s2) : -(double)(s2 - s);
    if( e>0 ){
      while( e>=100  ){
        e -= 100;
        dekkerMul2(rr, 1.0e+100, -1.5902891109759918046e+83);
      }
      while( e>=10   ){
        e -= 10;
        dekkerMul2(rr, 1.0e+10, 0.0);
      }
      while( e>=1    ){
        e -= 1;
        dekkerMul2(rr, 1.0e+01, 0.0);
      }
    }else{
      while( e<=-100 ){
        e += 100;
        dekkerMul2(rr, 1.0e-100, -1.99918998026028836196e-117);
      }
      while( e<=-10  ){
        e += 10;
        dekkerMul2(rr, 1.0e-10, -3.6432197315497741579e-27);
      }
      while( e<=-1   ){
        e += 1;
        dekkerMul2(rr, 1.0e-01, -5.5511151231257827021e-18);
      }
    }
    *pResult = rr[0]+rr[1];
    if( sqlite3IsNaN(*pResult) ) *pResult = 1e300*1e300;
  }
  if( sign<0 ) *pResult = -*pResult;
  assert( !sqlite3IsNaN(*pResult) );

atof_return:
  /* return true if number and no extra non-whitespace characters after */
  if( z==zEnd && nDigit>0 && eValid && eType>0 ){
    return eType;
  }else if( eType>=2 && (eType==3 || eValid) && nDigit>0 ){
    return -1;
  }else{
    return 0;
  }
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}